

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::VideoTrack::SetProjection(VideoTrack *this,Projection *projection)

{
  bool bVar1;
  ProjectionType type;
  Projection *this_00;
  pointer pPVar2;
  uint8_t *puVar3;
  Projection *in_RSI;
  long in_RDI;
  float fVar4;
  unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> projection_ptr;
  pointer in_stack_ffffffffffffff58;
  void *pvVar5;
  pointer in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint8_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 local_1;
  
  this_00 = (Projection *)operator_new(0x20);
  Projection::Projection(this_00);
  std::unique_ptr<mkvmuxer::Projection,std::default_delete<mkvmuxer::Projection>>::
  unique_ptr<std::default_delete<mkvmuxer::Projection>,void>
            ((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pPVar2 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::get
                     ((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                       *)in_stack_ffffffffffffff60);
  if (pPVar2 == (pointer)0x0) {
    local_1 = false;
  }
  else {
    puVar3 = Projection::private_data(in_RSI);
    if (puVar3 != (uint8_t *)0x0) {
      std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::operator->
                ((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> *)
                 0x162f5a);
      Projection::private_data(in_RSI);
      Projection::private_data_length(in_RSI);
      bVar1 = Projection::SetProjectionPrivate
                        ((Projection *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                         ,in_stack_ffffffffffffff70,
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (!bVar1) {
        local_1 = false;
        goto LAB_0016310d;
      }
    }
    pPVar2 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                         *)0x162fe6);
    type = Projection::type(in_RSI);
    Projection::set_type(pPVar2,type);
    pPVar2 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                         *)0x16301b);
    fVar4 = Projection::pose_yaw(in_RSI);
    Projection::set_pose_yaw(pPVar2,fVar4);
    pPVar2 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                         *)0x163054);
    fVar4 = Projection::pose_pitch(in_RSI);
    Projection::set_pose_pitch(pPVar2,fVar4);
    in_stack_ffffffffffffff60 =
         std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
         operator->((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> *)
                    0x16308d);
    fVar4 = Projection::pose_roll(in_RSI);
    Projection::set_pose_roll(in_stack_ffffffffffffff60,fVar4);
    pvVar5 = *(void **)(in_RDI + 0xf0);
    if (pvVar5 != (void *)0x0) {
      Projection::~Projection(in_stack_ffffffffffffff60);
      operator_delete(pvVar5);
    }
    pPVar2 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             release((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> *
                     )0x1630ee);
    *(pointer *)(in_RDI + 0xf0) = pPVar2;
    local_1 = true;
  }
LAB_0016310d:
  std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::~unique_ptr
            ((unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> *)
             in_stack_ffffffffffffff60);
  return local_1;
}

Assistant:

bool VideoTrack::SetProjection(const Projection& projection) {
  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  if (projection.private_data()) {
    if (!projection_ptr->SetProjectionPrivate(
            projection.private_data(), projection.private_data_length())) {
      return false;
    }
  }

  projection_ptr->set_type(projection.type());
  projection_ptr->set_pose_yaw(projection.pose_yaw());
  projection_ptr->set_pose_pitch(projection.pose_pitch());
  projection_ptr->set_pose_roll(projection.pose_roll());
  delete projection_;
  projection_ = projection_ptr.release();
  return true;
}